

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_2dPoint __thiscall
ON_SubDFace::PackRectCorner(ON_SubDFace *this,bool bGridOrder,int corner_index)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  ON_2dPoint OVar6;
  ON_2dPoint local_28;
  
  dVar4 = ON_2dPoint::NanPoint.x;
  dVar5 = ON_2dPoint::NanPoint.y;
  if ((this->m_pack_status_bits & 4) != 0) {
    uVar2 = corner_index & 3;
    uVar3 = uVar2;
    if (((bGridOrder) && (uVar3 = 3, uVar2 != 2)) && (uVar3 = 2, uVar2 != 3)) {
      uVar3 = uVar2;
    }
    iVar1 = *(int *)(&DAT_006dd1d0 + (ulong)(this->m_pack_status_bits & 3) * 4);
    ON_2dPoint::ON_2dPoint(&local_28,this->m_pack_rect_origin);
    dVar5 = local_28.y;
    dVar4 = local_28.x;
    ON_2dVector::ON_2dVector((ON_2dVector *)&local_28,this->m_pack_rect_size);
    switch(uVar3 + iVar1 & 3) {
    case 0:
      break;
    case 1:
      dVar4 = dVar4 + local_28.x;
      break;
    case 2:
      dVar4 = dVar4 + local_28.x;
      dVar5 = dVar5 + local_28.y;
      break;
    case 3:
      dVar5 = dVar5 + local_28.y;
    }
  }
  OVar6.y = dVar5;
  OVar6.x = dVar4;
  return OVar6;
}

Assistant:

const ON_2dPoint ON_SubDFace::PackRectCorner(bool bGridOrder, int corner_index) const
{
  if (0 == (m_pack_status_bits & ON_SubDFace::PackStatusBits::PackRectSet))
    return ON_2dPoint::NanPoint;

  corner_index = ((corner_index % 4) + 4) % 4;
  // now corner_index = 0,1,2 or 3.

  if (bGridOrder)
  {
    if (2 == corner_index)
      corner_index = 3;
    else if (3 == corner_index)
      corner_index = 2;
  }
  // now corner index is a counter-clockwise corner index

  int packrot_dex = 0;
  switch (m_pack_status_bits & ON_SubDFace::PackStatusBits::PackingRotateMask)
  {
  case ON_SubDFace::PackStatusBits::PackingRotate90:
    packrot_dex = 3;
    break;
  case ON_SubDFace::PackStatusBits::PackingRotate180:
    packrot_dex = 2;
    break;
  case ON_SubDFace::PackStatusBits::PackingRotate270:
    packrot_dex = 1;
    break;
  }

  corner_index = (corner_index + packrot_dex) % 4;
  // now the packing rotation is taken into account.

  ON_2dPoint corner = PackRectOrigin();
  const ON_2dVector delta = PackRectSize();
  switch (corner_index)
  {
  case 1:
    corner.x += delta.x;
    break;
  case 2:
    corner.x += delta.x;
    corner.y += delta.y;
    break;
  case 3:
    corner.y += delta.y;
    break;
  }

  return corner;
}